

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

bool duckdb::FromCStringCastWrapper<duckdb::TryCast>::Operation<char*,duckdb::timestamp_t>
               (char *input_str,timestamp_t *result)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  string_t input;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 local_1c;
  
  sVar3 = strlen(input_str);
  uVar2 = (uint)sVar3;
  if (uVar2 < 0xd) {
    local_1c = 0;
    uStack_24 = 0;
    uStack_20 = 0;
    if (uVar2 == 0) {
      input_str = (char *)0x0;
    }
    else {
      switchD_00b03519::default(&uStack_24,input_str,(ulong)(uVar2 & 0xf));
      input_str = (char *)CONCAT44(local_1c,uStack_20);
    }
  }
  else {
    uStack_24 = *(undefined4 *)input_str;
  }
  input.value._4_1_ = (undefined1)uStack_24;
  input.value._5_1_ = uStack_24._1_1_;
  input.value._6_1_ = uStack_24._2_1_;
  input.value._7_1_ = uStack_24._3_1_;
  input.value.pointer.length = uVar2;
  input.value.pointer.ptr = input_str;
  bVar1 = TryCast::Operation<duckdb::string_t,duckdb::timestamp_t>(input,result,false);
  return bVar1;
}

Assistant:

static bool Operation(SOURCE_TYPE input_str, RESULT_TYPE &result) {
		string_t input(input_str);
		return OP::template Operation<string_t, RESULT_TYPE>(input, result);
	}